

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantInnerTriangleSetCase::genTessLevelCases
          (vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
           *__return_storage_ptr__,InvariantInnerTriangleSetCase *this)

{
  pointer pTVar1;
  uint uVar2;
  int subNdx;
  int iVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  LevelCase levelCase;
  TessLevels levels;
  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  baseResults;
  Random rnd;
  value_type local_98;
  value_type local_78;
  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  local_58;
  deRandom local_40;
  
  PrimitiveSetInvarianceCase::genTessLevelCases(&local_58,&this->super_PrimitiveSetInvarianceCase);
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&local_40,0x7b);
  uVar2 = (uint)((ulong)((long)local_58.
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_58.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      pTVar1 = local_58.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4].levels.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_78.outer._8_8_ = *(undefined8 *)(pTVar1->outer + 2);
      local_78.inner = *&pTVar1->inner;
      local_78.outer._0_8_ = *(undefined8 *)pTVar1->outer;
      local_98.levels.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      local_98.levels.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      local_98.mem = 0;
      local_98.levels.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.levels.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_98.levels.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      iVar3 = 0;
      do {
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
        ::push_back(&local_98.levels,&local_78);
        lVar5 = 2;
        do {
          fVar6 = deRandom_getFloat(&local_40);
          *(float *)((long)local_78.inner + lVar5 * 4) = fVar6 * 14.0 + 2.0;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 6);
        if ((this->super_PrimitiveSetInvarianceCase).m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
        {
          fVar6 = deRandom_getFloat(&local_40);
          local_78.inner[1] = fVar6 * 14.0 + 2.0;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 4);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
      ::push_back(__return_storage_ptr__,&local_98);
      if (local_98.levels.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.levels.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT44(local_98.levels.
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 local_98.levels.
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                        (long)local_98.levels.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uVar2 & 0x7fffffff));
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  ::~vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

virtual vector<LevelCase> genTessLevelCases (void) const
	{
		const int					numSubCases		= 4;
		const vector<LevelCase>		baseResults		= PrimitiveSetInvarianceCase::genTessLevelCases();
		vector<LevelCase>			result;
		de::Random					rnd				(123);

		// Generate variants with different values for irrelevant levels.
		for (int baseNdx = 0; baseNdx < (int)baseResults.size(); baseNdx++)
		{
			const TessLevels&	base	= baseResults[baseNdx].levels[0];
			TessLevels			levels	= base;
			LevelCase			levelCase;

			for (int subNdx = 0; subNdx < numSubCases; subNdx++)
			{
				levelCase.levels.push_back(levels);

				for (int i = 0; i < DE_LENGTH_OF_ARRAY(levels.outer); i++)
					levels.outer[i] = rnd.getFloat(2.0f, 16.0f);
				if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
					levels.inner[1] = rnd.getFloat(2.0f, 16.0f);
			}

			result.push_back(levelCase);
		}

		return result;
	}